

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O0

int nghttp2_http_on_data_chunk(nghttp2_stream *stream,size_t n)

{
  size_t n_local;
  nghttp2_stream *stream_local;
  int local_4;
  
  stream->recv_content_length = n + stream->recv_content_length;
  if (((stream->http_flags & 0x4000) == 0) &&
     ((stream->content_length == -1 || (stream->recv_content_length <= stream->content_length)))) {
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int nghttp2_http_on_data_chunk(nghttp2_stream *stream, size_t n) {
  stream->recv_content_length += (int64_t)n;

  if ((stream->http_flags & NGHTTP2_HTTP_FLAG_EXPECT_FINAL_RESPONSE) ||
      (stream->content_length != -1 &&
       stream->recv_content_length > stream->content_length)) {
    return -1;
  }

  return 0;
}